

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

void __thiscall
pbrt::PiecewiseConstant1D::PiecewiseConstant1D
          (PiecewiseConstant1D *this,span<const_float> f,Float min,Float max,Allocator alloc)

{
  char acVar1 [4];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  char (*args_4) [4];
  iterator args_5;
  char *pcVar4;
  reference pvVar5;
  size_t index;
  reference file;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RDI;
  float in_XMM0_Da;
  float fVar6;
  float in_XMM1_Da;
  undefined1 auVar7 [64];
  size_t i_2;
  size_t i_1;
  int vb_1;
  value_type_conflict1 va_1;
  size_t i;
  size_t n;
  Float *f_1;
  iterator __end2;
  iterator __begin2;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *__range2;
  Float vb;
  Float va;
  polymorphic_allocator<std::byte> *in_stack_fffffffffffffe88;
  polymorphic_allocator<float> *in_stack_fffffffffffffe90;
  polymorphic_allocator<float> *in_stack_fffffffffffffe98;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_fffffffffffffeb0;
  char (*in_stack_fffffffffffffed8) [4];
  undefined4 in_stack_fffffffffffffee0;
  value_type_conflict1 in_stack_fffffffffffffee4;
  reference in_stack_fffffffffffffee8;
  reference in_stack_fffffffffffffef0;
  int line;
  char *in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  LogLevel level;
  char (*in_stack_ffffffffffffff10) [4];
  char *args_2;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this_00;
  ulong local_98;
  ulong local_90;
  ulong local_80;
  char *local_60;
  span<const_float> local_10;
  
  level = (LogLevel)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  args_4 = (char (*) [4])pstd::span<const_float>::begin(&local_10);
  args_5 = pstd::span<const_float>::end(&local_10);
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator<std::byte>
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>::vector<float_const*>
            (in_stack_fffffffffffffeb0,
             (float *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
             (float *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  pstd::span<const_float>::size(&local_10);
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator<std::byte>
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  *(float *)&in_RDI[2].alloc.memoryResource = in_XMM0_Da;
  *(float *)((long)&in_RDI[2].alloc.memoryResource + 4) = in_XMM1_Da;
  *(undefined4 *)&in_RDI[2].ptr = 0;
  if (in_XMM1_Da <= in_XMM0_Da) {
    LogFatal<char_const(&)[4],char_const(&)[4],char_const(&)[4],float&,char_const(&)[4],float&>
              (level,in_stack_fffffffffffffef8,(int)((ulong)in_stack_fffffffffffffef0 >> 0x20),
               (char *)in_stack_fffffffffffffee8,
               (char (*) [4])CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8,in_stack_ffffffffffffff10,(float *)in_RDI,args_4,args_5);
  }
  this_00 = in_RDI;
  local_60 = (char *)pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::begin(in_RDI);
  args_2 = local_60;
  pcVar4 = (char *)pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::end(in_RDI);
  for (; local_60 != pcVar4; local_60 = local_60 + 4) {
    fVar6 = *(float *)local_60;
    std::abs((int)in_RDI);
    *(float *)local_60 = fVar6;
  }
  pvVar5 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[](this_00 + 1,0);
  *pvVar5 = 0.0;
  index = pstd::span<const_float>::size(&local_10);
  local_80 = 1;
  while( true ) {
    line = (int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
    if (index + 1 <= local_80) {
      pvVar5 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                         (this_00 + 1,index);
      *(value_type_conflict1 *)&this_00[2].ptr = *pvVar5;
      fVar6 = *(float *)&this_00[2].ptr;
      auVar7 = ZEXT1664((undefined1  [16])0x0);
      if ((fVar6 != 0.0) || (NAN(fVar6))) {
        for (local_98 = 1; local_98 < index + 1; local_98 = local_98 + 1) {
          fVar6 = *(float *)&this_00[2].ptr;
          pvVar5 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                             (this_00 + 1,local_98);
          *pvVar5 = *pvVar5 / fVar6;
        }
      }
      else {
        for (local_90 = 1; local_90 < index + 1; local_90 = local_90 + 1) {
          auVar2 = vcvtusi2ss_avx512f(ZEXT416((uint)fVar6),local_90);
          auVar3 = vcvtusi2ss_avx512f(auVar7._0_16_,index);
          auVar7 = ZEXT1664(auVar3);
          fVar6 = auVar2._0_4_ / auVar3._0_4_;
          pvVar5 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                             (this_00 + 1,local_90);
          *pvVar5 = fVar6;
        }
      }
      return;
    }
    file = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                     (this_00,local_80 - 1);
    if (*file < 0.0) break;
    in_stack_fffffffffffffef0 =
         pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                   (this_00 + 1,local_80 - 1);
    in_stack_fffffffffffffee4 = *in_stack_fffffffffffffef0;
    in_stack_fffffffffffffee8 =
         pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                   (this_00,local_80 - 1);
    auVar2 = vcvtusi2ss_avx512f(ZEXT416((uint)(in_XMM1_Da - in_XMM0_Da)),index);
    acVar1 = (char  [4])
             (in_stack_fffffffffffffee4 +
             (*in_stack_fffffffffffffee8 * (in_XMM1_Da - in_XMM0_Da)) / auVar2._0_4_);
    in_stack_fffffffffffffed8 =
         (char (*) [4])
         pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                   (this_00 + 1,local_80);
    *in_stack_fffffffffffffed8 = acVar1;
    local_80 = local_80 + 1;
  }
  LogFatal<char_const(&)[12],char_const(&)[2],char_const(&)[12],float&,char_const(&)[2],int&>
            ((LogLevel)((ulong)pvVar5 >> 0x20),(char *)file,line,(char *)in_stack_fffffffffffffee8,
             (char (*) [12])CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (char (*) [2])in_stack_fffffffffffffed8,(char (*) [12])args_2,(float *)this_00,
             (char (*) [2])args_4,(int *)args_5);
}

Assistant:

PiecewiseConstant1D(pstd::span<const Float> f, Float min, Float max,
                        Allocator alloc = {})
        : func(f.begin(), f.end(), alloc), cdf(f.size() + 1, alloc), min(min), max(max) {
        CHECK_GT(max, min);
        // Take absolute value of _func_
        for (Float &f : func)
            f = std::abs(f);

        // Compute integral of step function at $x_i$
        cdf[0] = 0;
        size_t n = f.size();
        for (size_t i = 1; i < n + 1; ++i) {
            CHECK_GE(func[i - 1], 0);
            cdf[i] = cdf[i - 1] + func[i - 1] * (max - min) / n;
        }

        // Transform step function integral into CDF
        funcInt = cdf[n];
        if (funcInt == 0)
            for (size_t i = 1; i < n + 1; ++i)
                cdf[i] = Float(i) / Float(n);
        else
            for (size_t i = 1; i < n + 1; ++i)
                cdf[i] /= funcInt;
    }